

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::dragEnterEvent(QAbstractItemView *this,QDragEnterEvent *event)

{
  bool bVar1;
  DragDropMode DVar2;
  QDropEvent *__addr_len;
  sockaddr *__addr;
  int __fd;
  QDragMoveEvent *in_RSI;
  QDropEvent *in_RDI;
  long in_FS_OFFSET;
  QDropEvent *in_stack_00000010;
  DropAction in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  char cVar3;
  QFlagsStorageHelper<Qt::DropAction,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DVar2 = dragDropMode((QAbstractItemView *)
                       CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  __addr_len = (QDropEvent *)(ulong)DVar2;
  cVar3 = '\0';
  if (DVar2 == InternalMove) {
    __addr_len = (QDropEvent *)QDropEvent::source();
    in_stack_ffffffffffffffcc = CONCAT13(1,(int3)in_stack_ffffffffffffffcc);
    if (__addr_len == in_RDI) {
      QDropEvent::possibleActions(in_RDI);
      local_c.super_QFlagsStorage<Qt::DropAction>.i =
           (QFlagsStorage<Qt::DropAction>)
           QFlags<Qt::DropAction>::operator&
                     ((QFlags<Qt::DropAction> *)in_RDI,in_stack_ffffffffffffffcc);
      bVar1 = QFlags<Qt::DropAction>::operator!((QFlags<Qt::DropAction> *)&local_c);
      in_stack_ffffffffffffffcc = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffcc);
    }
    cVar3 = (char)(in_stack_ffffffffffffffcc >> 0x18);
  }
  if (cVar3 == '\0') {
    d_func((QAbstractItemView *)0x806226);
    __fd = (int)in_RSI;
    bVar1 = QAbstractItemViewPrivate::canDrop((QAbstractItemViewPrivate *)event,in_stack_00000010);
    if (bVar1) {
      QDragMoveEvent::accept(in_RSI,__fd,__addr,(socklen_t *)__addr_len);
      setState((QAbstractItemView *)in_RDI,in_stack_ffffffffffffffcc);
    }
    else {
      QDragMoveEvent::ignore((QDragMoveEvent *)0x80625e);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::dragEnterEvent(QDragEnterEvent *event)
{
    if (dragDropMode() == InternalMove
        && (event->source() != this|| !(event->possibleActions() & Qt::MoveAction)))
        return;

    if (d_func()->canDrop(event)) {
        event->accept();
        setState(DraggingState);
    } else {
        event->ignore();
    }
}